

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O1

int ED25519_sign(uint8_t *out_sig,uint8_t *message,size_t message_len,uint8_t *private_key)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  ulong uVar40;
  ulong uVar41;
  uint uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  long lVar46;
  ulong uVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  long lVar56;
  uint8_t nonce [64];
  uint8_t hram [64];
  ge_p3 R;
  SHA512_CTX hash_ctx;
  ushort local_268;
  byte local_266;
  byte local_265;
  byte local_264;
  byte local_263;
  byte local_262;
  byte local_261;
  byte local_260;
  byte local_25f;
  byte local_25e;
  byte local_25d;
  byte local_25c;
  byte local_25b;
  byte local_25a;
  byte local_259;
  byte local_258;
  byte local_257;
  byte local_256;
  byte local_255;
  byte local_254;
  ushort local_253;
  byte local_251;
  byte local_250;
  byte local_24f;
  byte local_24e;
  byte local_24d;
  byte local_24c;
  byte local_24b;
  byte local_24a;
  byte local_249;
  ushort local_228;
  byte local_226;
  byte local_225;
  byte local_224;
  byte local_223;
  byte local_222;
  byte local_221;
  byte local_220;
  byte local_21f;
  byte local_21e;
  byte local_21d;
  byte local_21c;
  byte local_21b;
  byte local_21a;
  byte local_219;
  byte local_218;
  byte local_217;
  byte local_216;
  byte local_215;
  byte local_214;
  ushort local_213;
  byte local_211;
  byte local_210;
  byte local_20f;
  byte local_20e;
  byte local_20d;
  byte local_20c;
  byte local_20b;
  byte local_20a;
  byte local_209;
  undefined1 local_208 [32];
  ushort local_1e8;
  byte local_1e6;
  byte local_1e5;
  byte local_1e4;
  byte local_1e3;
  byte local_1e2;
  byte local_1e1;
  byte local_1e0;
  byte local_1df;
  byte local_1de;
  byte local_1dd;
  byte local_1dc;
  byte local_1db;
  byte local_1da;
  byte local_1d9;
  byte local_1d8;
  byte local_1d7;
  byte local_1d6;
  byte local_1d5;
  byte local_1d4;
  ushort local_1d3;
  byte local_1d1;
  byte local_1d0;
  byte local_1cf;
  byte local_1ce;
  byte local_1cd;
  byte local_1cc;
  byte local_1cb;
  byte local_1ca;
  byte local_1c9;
  ge_p3 local_1a8;
  SHA512_CTX local_108;
  
  SHA512(private_key,0x20,(uchar *)&local_228);
  local_228 = local_228 & 0xfff8;
  local_209 = local_209 & 0x3f | 0x40;
  SHA512_Init(&local_108);
  SHA512_Update(&local_108,local_208,0x20);
  SHA512_Update(&local_108,message,message_len);
  SHA512_Final((uchar *)&local_268,&local_108);
  x25519_sc_reduce((uint8_t *)&local_268);
  x25519_ge_scalarmult_base(&local_1a8,(uint8_t *)&local_268);
  ge_p3_tobytes(out_sig,&local_1a8);
  SHA512_Init(&local_108);
  SHA512_Update(&local_108,out_sig,0x20);
  SHA512_Update(&local_108,private_key + 0x20,0x20);
  SHA512_Update(&local_108,message,message_len);
  SHA512_Final((uchar *)&local_1e8,&local_108);
  x25519_sc_reduce((uint8_t *)&local_1e8);
  uVar51 = (ulong)((local_1e6 & 0x1f) << 0x10) | (ulong)local_1e8;
  uVar17 = (ulong)((local_1d1 & 0x1f) << 0x10) | (ulong)local_1d3;
  uVar54 = (ulong)((local_226 & 0x1f) << 0x10) | (ulong)local_228;
  uVar18 = (ulong)((local_211 & 0x1f) << 0x10) | (ulong)local_213;
  lVar1 = uVar54 * uVar51 + ((ulong)((local_266 & 0x1f) << 0x10) | (ulong)local_268);
  uVar47 = (ulong)(((uint)local_1e3 << 0x18 | (uint)local_1e4 << 0x10 | (uint)local_1e5 << 8 |
                   (uint)local_1e6) >> 5 & 0x1fffff);
  uVar13 = (ulong)(((uint)local_223 << 0x18 | (uint)local_224 << 0x10 | (uint)local_225 << 8 |
                   (uint)local_226) >> 5 & 0x1fffff);
  uVar55 = (ulong)(((uint)local_1e1 << 0x10 | (uint)local_1e2 << 8 | (uint)local_1e3) >> 2 &
                  0x1fffff);
  uVar40 = (ulong)(((uint)local_221 << 0x10 | (uint)local_222 << 8 | (uint)local_223) >> 2 &
                  0x1fffff);
  lVar2 = uVar54 * uVar55 + uVar40 * uVar51 + uVar13 * uVar47 +
          (ulong)(((uint)local_261 << 0x10 | (uint)local_262 << 8 | (uint)local_263) >> 2 & 0x1fffff
                 );
  uVar22 = (ulong)(((uint)local_21e << 0x18 | (uint)local_21f << 0x10 | (uint)local_220 << 8 |
                   (uint)local_221) >> 7 & 0x1fffff);
  uVar25 = (ulong)(((uint)local_1de << 0x18 | (uint)local_1df << 0x10 | (uint)local_1e0 << 8 |
                   (uint)local_1e1) >> 7 & 0x1fffff);
  uVar45 = (ulong)(((uint)local_21b << 0x18 | (uint)local_21c << 0x10 | (uint)local_21d << 8 |
                   (uint)local_21e) >> 4 & 0x1fffff);
  uVar52 = (ulong)(((uint)local_1db << 0x18 | (uint)local_1dc << 0x10 | (uint)local_1dd << 8 |
                   (uint)local_1de) >> 4 & 0x1fffff);
  lVar26 = uVar54 * uVar52 + uVar13 * uVar25 + uVar40 * uVar55 + uVar22 * uVar47 +
           uVar45 * uVar51 +
           (ulong)(((uint)local_25b << 0x18 | (uint)local_25c << 0x10 | (uint)local_25d << 8 |
                   (uint)local_25e) >> 4 & 0x1fffff);
  uVar24 = (ulong)(((uint)local_219 << 0x10 | (uint)local_21a << 8 | (uint)local_21b) >> 1 &
                  0x1fffff);
  uVar29 = (ulong)(((uint)local_1d9 << 0x10 | (uint)local_1da << 8 | (uint)local_1db) >> 1 &
                  0x1fffff);
  uVar28 = (ulong)(((uint)local_216 << 0x18 | (uint)local_217 << 0x10 | (uint)local_218 << 8 |
                   (uint)local_219) >> 6 & 0x1fffff);
  uVar43 = (ulong)(((uint)local_1d6 << 0x18 | (uint)local_1d7 << 0x10 | (uint)local_1d8 << 8 |
                   (uint)local_1d9) >> 6 & 0x1fffff);
  lVar27 = uVar54 * uVar43 + uVar13 * uVar29 + uVar40 * uVar52 + uVar22 * uVar25 +
           uVar45 * uVar55 + uVar24 * uVar47 + uVar28 * uVar51 +
           (ulong)(((uint)local_256 << 0x18 | (uint)local_257 << 0x10 | (uint)local_258 << 8 |
                   (uint)local_259) >> 6 & 0x1fffff);
  uVar44 = (ulong)(((uint)local_214 << 0x10 | (uint)local_215 << 8 | (uint)local_216) >> 3);
  uVar33 = (ulong)(((uint)local_1d4 << 0x10 | (uint)local_1d5 << 8 | (uint)local_1d6) >> 3);
  lVar34 = uVar54 * uVar17 + uVar13 * uVar33 + uVar40 * uVar43 + uVar22 * uVar29 +
           uVar45 * uVar52 + uVar24 * uVar25 + uVar28 * uVar55 +
           uVar44 * uVar47 + uVar18 * uVar51 + (ulong)local_253 +
           (ulong)((local_251 & 0x1f) << 0x10);
  uVar53 = (ulong)(((uint)local_20e << 0x18 | (uint)local_20f << 0x10 | (uint)local_210 << 8 |
                   (uint)local_211) >> 5 & 0x1fffff);
  uVar35 = (ulong)(((uint)local_1ce << 0x18 | (uint)local_1cf << 0x10 | (uint)local_1d0 << 8 |
                   (uint)local_1d1) >> 5 & 0x1fffff);
  uVar41 = (ulong)(((uint)local_20c << 0x10 | (uint)local_20d << 8 | (uint)local_20e) >> 2 &
                  0x1fffff);
  uVar30 = (ulong)(((uint)local_1cc << 0x10 | (uint)local_1cd << 8 | (uint)local_1ce) >> 2 &
                  0x1fffff);
  lVar38 = uVar54 * uVar30 + uVar40 * uVar17 + uVar13 * uVar35 + uVar22 * uVar33 + uVar45 * uVar43 +
           uVar24 * uVar29 + uVar28 * uVar52 + uVar44 * uVar25 +
           uVar18 * uVar55 + uVar53 * uVar47 + uVar41 * uVar51 +
           (ulong)(((uint)local_24c << 0x10 | (uint)local_24d << 8 | (uint)local_24e) >> 2 &
                  0x1fffff);
  uVar16 = (ulong)(((uint)local_209 << 0x18 | (uint)local_20a << 0x10 | (uint)local_20b << 8 |
                   (uint)local_20c) >> 7);
  uVar15 = (ulong)(((uint)local_1c9 << 0x18 | (uint)local_1ca << 0x10 | (uint)local_1cb << 8 |
                   (uint)local_1cc) >> 7);
  lVar31 = uVar13 * uVar15 + uVar40 * uVar30 + uVar22 * uVar35 + uVar45 * uVar17 +
           uVar24 * uVar33 + uVar28 * uVar43 + uVar44 * uVar29 +
           uVar18 * uVar52 + uVar53 * uVar25 + uVar41 * uVar55 + uVar47 * uVar16;
  lVar36 = uVar22 * uVar15 + uVar45 * uVar30 + uVar24 * uVar35 + uVar28 * uVar17 +
           uVar44 * uVar33 + uVar18 * uVar43 + uVar53 * uVar29 + uVar41 * uVar52 + uVar25 * uVar16;
  lVar48 = uVar24 * uVar15 + uVar28 * uVar30 + uVar44 * uVar35 + uVar18 * uVar17 +
           uVar53 * uVar33 + uVar41 * uVar43 + uVar29 * uVar16;
  lVar49 = uVar44 * uVar15 + uVar18 * uVar30 + uVar53 * uVar35 + uVar41 * uVar17 + uVar33 * uVar16;
  lVar23 = uVar53 * uVar15 + uVar41 * uVar30 + uVar35 * uVar16;
  uVar32 = lVar1 + 0x100000;
  lVar37 = (uVar32 >> 0x15) +
           (ulong)(((uint)local_263 << 0x18 | (uint)local_264 << 0x10 | (uint)local_265 << 8 |
                   (uint)local_266) >> 5 & 0x1fffff) + uVar54 * uVar47 + uVar13 * uVar51;
  uVar3 = lVar2 + 0x100000;
  lVar4 = (uVar3 >> 0x15) +
          uVar54 * uVar25 + uVar13 * uVar55 + uVar40 * uVar47 + uVar22 * uVar51 +
          (ulong)(((uint)local_25e << 0x18 | (uint)local_25f << 0x10 | (uint)local_260 << 8 |
                  (uint)local_261) >> 7 & 0x1fffff);
  uVar5 = lVar26 + 0x100000;
  lVar6 = (uVar5 >> 0x15) +
          uVar54 * uVar29 + uVar13 * uVar52 + uVar40 * uVar25 + uVar22 * uVar55 +
          uVar45 * uVar47 + uVar24 * uVar51 +
          (ulong)(((uint)local_259 << 0x10 | (uint)local_25a << 8 | (uint)local_25b) >> 1 & 0x1fffff
                 );
  uVar7 = lVar27 + 0x100000;
  lVar8 = (uVar7 >> 0x15) +
          uVar54 * uVar33 + uVar40 * uVar29 + uVar13 * uVar43 + uVar22 * uVar52 + uVar45 * uVar25 +
          uVar24 * uVar55 + uVar28 * uVar47 + uVar44 * uVar51 +
          (ulong)(((uint)local_254 << 0x10 | (uint)local_255 << 8 | (uint)local_256) >> 3);
  uVar9 = lVar34 + 0x100000;
  lVar10 = (uVar9 >> 0x15) +
           uVar54 * uVar35 + uVar13 * uVar17 + uVar40 * uVar33 + uVar22 * uVar43 +
           uVar45 * uVar29 + uVar24 * uVar52 + uVar28 * uVar25 +
           uVar44 * uVar55 + uVar18 * uVar47 + uVar53 * uVar51 +
           (ulong)(((uint)local_24e << 0x18 | (uint)local_24f << 0x10 | (uint)local_250 << 8 |
                   (uint)local_251) >> 5 & 0x1fffff);
  uVar11 = lVar38 + 0x100000;
  lVar12 = (uVar11 >> 0x15) +
           uVar54 * uVar15 + uVar13 * uVar30 + uVar40 * uVar35 + uVar22 * uVar17 +
           uVar45 * uVar33 + uVar24 * uVar43 + uVar28 * uVar29 +
           uVar44 * uVar52 + uVar18 * uVar25 + uVar53 * uVar55 + uVar41 * uVar47 +
           uVar51 * uVar16 +
           (ulong)(((uint)local_249 << 0x18 | (uint)local_24a << 0x10 | (uint)local_24b << 8 |
                   (uint)local_24c) >> 7);
  uVar13 = lVar31 + 0x100000;
  lVar14 = (uVar13 >> 0x15) +
           uVar40 * uVar15 + uVar22 * uVar30 + uVar45 * uVar35 + uVar24 * uVar17 +
           uVar28 * uVar33 + uVar44 * uVar43 + uVar18 * uVar29 +
           uVar53 * uVar52 + uVar41 * uVar25 + uVar55 * uVar16;
  uVar22 = lVar36 + 0x100000;
  lVar19 = (uVar22 >> 0x15) +
           uVar45 * uVar15 + uVar24 * uVar30 + uVar28 * uVar35 + uVar44 * uVar17 +
           uVar18 * uVar33 + uVar53 * uVar43 + uVar41 * uVar29 + uVar52 * uVar16;
  uVar24 = lVar48 + 0x100000;
  lVar20 = (uVar24 >> 0x15) +
           uVar28 * uVar15 + uVar44 * uVar30 + uVar18 * uVar35 + uVar53 * uVar17 +
           uVar41 * uVar33 + uVar43 * uVar16;
  uVar44 = lVar49 + 0x100000;
  lVar39 = (uVar44 >> 0x15) + uVar18 * uVar15 + uVar53 * uVar30 + uVar41 * uVar35 + uVar17 * uVar16;
  uVar33 = lVar23 + 0x100000;
  lVar21 = (uVar33 >> 0x15) + uVar41 * uVar15 + uVar30 * uVar16;
  uVar17 = uVar16 * uVar15 + 0x100000;
  uVar18 = lVar37 + 0x100000;
  uVar41 = lVar4 + 0x100000;
  uVar53 = lVar20 + 0x100000;
  lVar56 = (uVar53 >> 0x15) + (lVar49 - (uVar44 & 0xffffffffffe00000));
  uVar44 = lVar39 + 0x100000;
  lVar49 = (uVar44 >> 0x15) + (lVar23 - (uVar33 & 0xffffffffffe00000));
  lVar39 = lVar39 - (uVar44 & 0xffffffffffe00000);
  uVar44 = lVar21 + 0x100000;
  lVar23 = (uVar44 >> 0x15) + (uVar16 * uVar15 - (uVar17 & 0xffffffffffe00000));
  lVar21 = lVar21 - (uVar44 & 0xffffffffffe00000);
  uVar17 = uVar17 >> 0x15;
  uVar28 = lVar19 + 0x100000;
  lVar48 = ((uVar17 * -0xa6f7d + lVar48) - (uVar24 & 0xffffffffffe00000)) + (uVar28 >> 0x15);
  uVar15 = lVar14 + 0x100000;
  lVar50 = ((uVar17 * -0xf39ad + lVar36) - (uVar22 & 0xffffffffffe00000)) + (uVar15 >> 0x15) +
           lVar23 * 0x215d1 + lVar21 * -0xa6f7d;
  uVar16 = lVar12 + 0x100000;
  lVar31 = ((uVar17 * 0x72d18 + lVar31) - (uVar13 & 0xffffffffffe00000)) + lVar23 * 0x9fb67 +
           lVar49 * 0x215d1 + lVar21 * -0xf39ad + lVar39 * -0xa6f7d + (uVar16 >> 0x15);
  uVar22 = lVar6 + 0x100000;
  lVar27 = ((uVar22 >> 0x15) + lVar27 + lVar56 * 0xa2c13) - (uVar7 & 0xffffffffffe00000);
  uVar24 = lVar8 + 0x100000;
  lVar46 = ((lVar56 * 0x9fb67 + lVar39 * 0x72d18 + lVar49 * 0xa2c13 + lVar34) -
           (uVar9 & 0xffffffffffe00000)) + (uVar24 >> 0x15);
  uVar44 = lVar10 + 0x100000;
  lVar36 = (lVar56 * 0x215d1 + lVar38 +
            lVar39 * -0xf39ad + lVar49 * 0x9fb67 + lVar21 * 0x72d18 + lVar23 * 0xa2c13 +
           (uVar44 >> 0x15)) - (uVar11 & 0xffffffffffe00000);
  uVar33 = lVar27 + 0x100000;
  lVar38 = ((lVar39 * 0xa2c13 + lVar8 + lVar56 * 0x72d18) - (uVar24 & 0xffffffffffe00000)) +
           ((long)uVar33 >> 0x15);
  uVar24 = lVar46 + 0x100000;
  lVar34 = (lVar56 * -0xf39ad + lVar10 + lVar39 * 0x9fb67 + lVar49 * 0x72d18 + lVar21 * 0xa2c13 +
           ((long)uVar24 >> 0x15)) - (uVar44 & 0xffffffffffe00000);
  uVar44 = lVar36 + 0x100000;
  lVar10 = ((lVar56 * -0xa6f7d + lVar39 * 0x215d1 +
             lVar49 * -0xf39ad + lVar21 * 0x9fb67 + lVar23 * 0x72d18 + uVar17 * 0xa2c13 + lVar12) -
           (uVar16 & 0xffffffffffe00000)) + ((long)uVar44 >> 0x15);
  uVar16 = lVar31 + 0x100000;
  lVar8 = ((uVar17 * 0x9fb67 + lVar14) - (uVar15 & 0xffffffffffe00000)) + lVar23 * -0xf39ad +
          lVar49 * -0xa6f7d + lVar21 * 0x215d1 + ((long)uVar16 >> 0x15);
  uVar15 = lVar50 + 0x100000;
  lVar21 = ((uVar17 * 0x215d1 + lVar19) - (uVar28 & 0xffffffffffe00000)) + lVar23 * -0xa6f7d +
           ((long)uVar15 >> 0x15);
  uVar17 = lVar48 + 0x100000;
  lVar49 = ((long)uVar17 >> 0x15) + (lVar20 - (uVar53 & 0xffffffffffe00000));
  uVar53 = lVar10 + 0x100000;
  lVar23 = ((long)uVar53 >> 0x15) + (lVar31 - (uVar16 & 0xffffffffffe00000));
  uVar16 = lVar8 + 0x100000;
  lVar20 = ((long)uVar16 >> 0x15) + (lVar50 - (uVar15 & 0xffffffffffe00000));
  lVar8 = lVar8 - (uVar16 & 0xffffffffffe00000);
  uVar16 = lVar21 + 0x100000;
  lVar39 = ((long)uVar16 >> 0x15) + (lVar48 - (uVar17 & 0xffffffffffe00000));
  lVar21 = lVar21 - (uVar16 & 0xffffffffffe00000);
  uVar17 = lVar34 + 0x100000;
  lVar12 = (lVar49 * -0xa6f7d + lVar36 + ((long)uVar17 >> 0x15)) - (uVar44 & 0xffffffffffe00000);
  uVar16 = lVar38 + 0x100000;
  lVar19 = (lVar21 * -0xa6f7d + lVar46 + lVar39 * 0x215d1 + lVar49 * -0xf39ad +
           ((long)uVar16 >> 0x15)) - (uVar24 & 0xffffffffffe00000);
  lVar48 = ((lVar21 * -0xf39ad + lVar27 + lVar39 * 0x9fb67 + lVar49 * 0x72d18) -
           (uVar33 & 0xffffffffffe00000)) + lVar8 * -0xa6f7d + lVar20 * 0x215d1;
  lVar14 = lVar23 * 0xa2c13 + (lVar1 - (uVar32 & 0xffffffffffe00000));
  lVar31 = (((uVar18 >> 0x15) + lVar2) - (uVar3 & 0xffffffffffe00000)) + lVar20 * 0xa2c13 +
           lVar8 * 0x72d18 + lVar23 * 0x9fb67;
  lVar26 = (((uVar41 >> 0x15) + lVar26) - (uVar5 & 0xffffffffffe00000)) + lVar39 * 0xa2c13 +
           lVar21 * 0x72d18 + lVar20 * 0x9fb67 + lVar23 * 0x215d1 + lVar8 * -0xf39ad;
  uVar32 = lVar14 + 0x100000;
  lVar27 = ((long)uVar32 >> 0x15) +
           lVar23 * 0x72d18 + lVar8 * 0xa2c13 + (lVar37 - (uVar18 & 0xffffffffffe00000));
  uVar24 = lVar31 + 0x100000;
  lVar1 = ((long)uVar24 >> 0x15) +
          lVar23 * -0xf39ad +
          lVar8 * 0x9fb67 +
          lVar20 * 0x72d18 + lVar21 * 0xa2c13 + (lVar4 - (uVar41 & 0xffffffffffe00000));
  uVar44 = lVar26 + 0x100000;
  lVar2 = ((lVar49 * 0xa2c13 + lVar6 + lVar39 * 0x72d18 + lVar21 * 0x9fb67) -
          (uVar22 & 0xffffffffffe00000)) + lVar23 * -0xa6f7d + lVar8 * 0x215d1 + lVar20 * -0xf39ad +
          ((long)uVar44 >> 0x15);
  uVar22 = lVar48 + 0x100000;
  lVar20 = ((lVar21 * 0x215d1 + lVar38 + lVar39 * -0xf39ad + lVar49 * 0x9fb67) -
           (uVar16 & 0xffffffffffe00000)) + lVar20 * -0xa6f7d + ((long)uVar22 >> 0x15);
  uVar33 = lVar19 + 0x100000;
  lVar4 = (lVar49 * 0x215d1 + lVar34 + lVar39 * -0xa6f7d + ((long)uVar33 >> 0x15)) -
          (uVar17 & 0xffffffffffe00000);
  uVar17 = lVar12 + 0x100000;
  lVar8 = ((long)uVar17 >> 0x15) + (lVar10 - (uVar53 & 0xffffffffffe00000));
  uVar18 = lVar2 + 0x100000;
  uVar41 = lVar20 + 0x100000;
  uVar53 = lVar4 + 0x100000;
  uVar16 = lVar27 + 0x100000;
  uVar15 = lVar1 + 0x100000;
  uVar9 = lVar8 + 0x100000;
  lVar6 = (long)uVar9 >> 0x15;
  uVar32 = lVar6 * 0xa2c13 + (lVar14 - (uVar32 & 0xffffffffffe00000));
  uVar3 = ((lVar6 * 0x72d18 + lVar27) - (uVar16 & 0xffffffffffe00000)) + ((long)uVar32 >> 0x15);
  uVar5 = ((lVar6 * 0x9fb67 + lVar31) - (uVar24 & 0xffffffffffe00000)) + ((long)uVar16 >> 0x15) +
          ((long)uVar3 >> 0x15);
  uVar16 = ((lVar6 * -0xf39ad + lVar1) - (uVar15 & 0xffffffffffe00000)) + ((long)uVar5 >> 0x15);
  uVar11 = ((lVar6 * 0x215d1 + lVar26) - (uVar44 & 0xffffffffffe00000)) + ((long)uVar15 >> 0x15) +
           ((long)uVar16 >> 0x15);
  uVar24 = ((lVar6 * -0xa6f7d + lVar2) - (uVar18 & 0xffffffffffe00000)) + ((long)uVar11 >> 0x15);
  uVar13 = ((long)uVar24 >> 0x15) +
           ((long)uVar18 >> 0x15) + (lVar48 - (uVar22 & 0xffffffffffe00000));
  uVar44 = ((long)uVar13 >> 0x15) + (lVar20 - (uVar41 & 0xffffffffffe00000));
  uVar15 = ((long)uVar44 >> 0x15) +
           ((long)uVar41 >> 0x15) + (lVar19 - (uVar33 & 0xffffffffffe00000));
  uVar7 = ((long)uVar15 >> 0x15) + (lVar4 - (uVar53 & 0xffffffffffe00000));
  uVar22 = ((((long)uVar53 >> 0x15) + lVar12) - (uVar17 & 0xffffffffffe00000)) +
           ((long)uVar7 >> 0x15);
  lVar4 = ((long)uVar22 >> 0x15) + (lVar8 - (uVar9 & 0xffffffffffe00000));
  lVar1 = lVar4 >> 0x15;
  lVar2 = lVar1 * 0xa2c13 + (uVar32 & 0x1fffff);
  uVar32 = (lVar2 >> 0x15) + lVar1 * 0x72d18 + (uVar3 & 0x1fffff);
  uVar53 = ((long)uVar32 >> 0x15) + lVar1 * 0x9fb67 + (uVar5 & 0x1fffff);
  uVar41 = ((long)uVar53 >> 0x15) + lVar1 * -0xf39ad + (uVar16 & 0x1fffff);
  uVar18 = ((long)uVar41 >> 0x15) + lVar1 * 0x215d1 + (uVar11 & 0x1fffff);
  uVar17 = ((long)uVar18 >> 0x15) + lVar1 * -0xa6f7d + (uVar24 & 0x1fffff);
  uVar33 = ((long)uVar17 >> 0x15) + (uVar13 & 0x1fffff);
  uVar44 = ((long)uVar33 >> 0x15) + (uVar44 & 0x1fffff);
  lVar1 = ((long)uVar44 >> 0x15) + (uVar15 & 0x1fffff);
  uVar24 = (lVar1 >> 0x15) + (uVar7 & 0x1fffff);
  uVar22 = ((long)uVar24 >> 0x15) + (uVar22 & 0x1fffff);
  uVar42 = (int)(uVar22 >> 0x15) + ((uint)lVar4 & 0x1fffff);
  out_sig[0x20] = (uint8_t)lVar2;
  out_sig[0x21] = (uint8_t)((ulong)lVar2 >> 8);
  out_sig[0x22] = (byte)((uint)uVar32 << 5) | (byte)((ulong)lVar2 >> 0x10) & 0x1f;
  out_sig[0x23] = (uint8_t)(uVar32 >> 3);
  out_sig[0x24] = (uint8_t)(uVar32 >> 0xb);
  out_sig[0x25] = ((byte)((uint)uVar32 >> 0x13) & 3) + (char)uVar53 * '\x04';
  out_sig[0x26] = (uint8_t)(uVar53 >> 6);
  out_sig[0x27] = (byte)((uint)uVar41 << 7) | (byte)((uint)uVar53 >> 0xe) & 0x7f;
  out_sig[0x28] = (uint8_t)(uVar41 >> 1);
  out_sig[0x29] = (uint8_t)(uVar41 >> 9);
  out_sig[0x2a] = (byte)((uint)uVar18 << 4) | (byte)((uint)uVar41 >> 0x11) & 0xf;
  out_sig[0x2b] = (uint8_t)(uVar18 >> 4);
  out_sig[0x2c] = (uint8_t)(uVar18 >> 0xc);
  out_sig[0x2d] = ((byte)((uint)uVar18 >> 0x14) & 1) + (char)uVar17 * '\x02';
  out_sig[0x2e] = (uint8_t)(uVar17 >> 7);
  out_sig[0x2f] = (byte)((uint)uVar33 << 6) | (byte)((uint)uVar17 >> 0xf) & 0x3f;
  out_sig[0x30] = (uint8_t)(uVar33 >> 2);
  out_sig[0x31] = (uint8_t)(uVar33 >> 10);
  out_sig[0x32] = ((byte)((uint)uVar33 >> 0x12) & 7) + (char)uVar44 * '\b';
  out_sig[0x33] = (uint8_t)(uVar44 >> 5);
  out_sig[0x34] = (uint8_t)((uint)uVar44 >> 0xd);
  out_sig[0x35] = (uint8_t)lVar1;
  out_sig[0x36] = (uint8_t)((ulong)lVar1 >> 8);
  out_sig[0x37] = (byte)((uint)uVar24 << 5) | (byte)((ulong)lVar1 >> 0x10) & 0x1f;
  out_sig[0x38] = (uint8_t)(uVar24 >> 3);
  out_sig[0x39] = (uint8_t)(uVar24 >> 0xb);
  out_sig[0x3a] = ((byte)((uint)uVar24 >> 0x13) & 3) + (char)uVar22 * '\x04';
  out_sig[0x3b] = (uint8_t)(uVar22 >> 6);
  out_sig[0x3c] = (char)uVar42 * -0x80 | (byte)((uint)uVar22 >> 0xe) & 0x7f;
  out_sig[0x3d] = (uint8_t)(uVar42 >> 1);
  out_sig[0x3e] = (uint8_t)(uVar42 >> 9);
  out_sig[0x3f] = (uint8_t)(uVar42 >> 0x11);
  return 1;
}

Assistant:

int ED25519_sign(uint8_t out_sig[64], const uint8_t *message,
                 size_t message_len, const uint8_t private_key[64]) {
  // NOTE: The documentation on this function says that it returns zero on
  // allocation failure. While that can't happen with the current
  // implementation, we want to reserve the ability to allocate in this
  // implementation in the future.

  uint8_t az[SHA512_DIGEST_LENGTH];
  SHA512(private_key, 32, az);

  az[0] &= 248;
  az[31] &= 63;
  az[31] |= 64;

  SHA512_CTX hash_ctx;
  SHA512_Init(&hash_ctx);
  SHA512_Update(&hash_ctx, az + 32, 32);
  SHA512_Update(&hash_ctx, message, message_len);
  uint8_t nonce[SHA512_DIGEST_LENGTH];
  SHA512_Final(nonce, &hash_ctx);

  x25519_sc_reduce(nonce);
  ge_p3 R;
  x25519_ge_scalarmult_base(&R, nonce);
  ge_p3_tobytes(out_sig, &R);

  SHA512_Init(&hash_ctx);
  SHA512_Update(&hash_ctx, out_sig, 32);
  SHA512_Update(&hash_ctx, private_key + 32, 32);
  SHA512_Update(&hash_ctx, message, message_len);
  uint8_t hram[SHA512_DIGEST_LENGTH];
  SHA512_Final(hram, &hash_ctx);

  x25519_sc_reduce(hram);
  sc_muladd(out_sig + 32, hram, az, nonce);

  // The signature is computed from the private key, but is public.
  CONSTTIME_DECLASSIFY(out_sig, 64);
  return 1;
}